

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool arm_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cpu,CPUBreakpoint *bp)

{
  int iVar1;
  int iVar2;
  target_ulong tVar3;
  TCGContext_conflict1 *pTVar4;
  TCGContext_conflict1 *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *local_30;
  
  if ((bp->flags & 0x20) == 0) {
    tVar3 = dcbase->pc_next;
    pTVar4 = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
    iVar1 = *(int *)&dcbase[2].tb;
    if (iVar1 != 0) {
      iVar2 = *(int *)((long)&dcbase[2].tb + 4);
      pTVar6 = tcg_temp_new_internal_aarch64(pTVar4,TCG_TYPE_I32,false);
      tcg_gen_op2_aarch64(pTVar4,INDEX_op_movi_i32,(TCGArg)pTVar6,(long)(iVar1 >> 1 | iVar2 << 4));
      tcg_gen_op3_aarch64(pTVar4,INDEX_op_st_i32,(TCGArg)pTVar6,
                          (TCGArg)(pTVar4->cpu_env + (long)pTVar4),0x224);
      tcg_temp_free_internal_aarch64(pTVar4,pTVar6);
    }
    pTVar5 = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
    tcg_gen_op2_aarch64(pTVar5,INDEX_op_movi_i32,(TCGArg)(pTVar5->cpu_R[0xf] + (long)pTVar5),
                        (long)(int)tVar3);
    gen_exception_internal(pTVar4,0x10002);
    dcbase->is_jmp = DISAS_NORETURN;
    dcbase->pc_next = dcbase->pc_next + 2;
  }
  else {
    pTVar4 = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
    iVar1 = *(int *)&dcbase[2].tb;
    if (iVar1 != 0) {
      iVar2 = *(int *)((long)&dcbase[2].tb + 4);
      pTVar6 = tcg_temp_new_internal_aarch64(pTVar4,TCG_TYPE_I32,false);
      tcg_gen_op2_aarch64(pTVar4,INDEX_op_movi_i32,(TCGArg)pTVar6,(long)(iVar1 >> 1 | iVar2 << 4));
      tcg_gen_op3_aarch64(pTVar4,INDEX_op_st_i32,(TCGArg)pTVar6,
                          (TCGArg)(pTVar4->cpu_env + (long)pTVar4),0x224);
      tcg_temp_free_internal_aarch64(pTVar4,pTVar6);
    }
    pTVar5 = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
    tcg_gen_op2_aarch64(pTVar5,INDEX_op_movi_i32,(TCGArg)(pTVar5->cpu_R[0xf] + (long)pTVar5),
                        (long)(int)dcbase->pc_next);
    local_30 = (TCGTemp *)(pTVar4->cpu_env + (long)pTVar4);
    tcg_gen_callN_aarch64(pTVar4,helper_check_breakpoints_aarch64,(TCGTemp *)0x0,1,&local_30);
    dcbase->is_jmp = DISAS_TOO_MANY;
  }
  return true;
}

Assistant:

static bool arm_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cpu,
                                    const CPUBreakpoint *bp)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    if (bp->flags & BP_CPU) {
        gen_set_condexec(dc);
        gen_set_pc_im(dc, dc->base.pc_next);
        gen_helper_check_breakpoints(tcg_ctx, tcg_ctx->cpu_env);
        /* End the TB early; it's likely not going to be executed */
        dc->base.is_jmp = DISAS_TOO_MANY;
    } else {
        gen_exception_internal_insn(dc, dc->base.pc_next, EXCP_DEBUG);
        /* The address covered by the breakpoint must be
           included in [tb->pc, tb->pc + tb->size) in order
           to for it to be properly cleared -- thus we
           increment the PC here so that the logic setting
           tb->size below does the right thing.  */
        /* TODO: Advance PC by correct instruction length to
         * avoid disassembler error messages */
        dc->base.pc_next += 2;
        dc->base.is_jmp = DISAS_NORETURN;
    }

    return true;
}